

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O1

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
Distributions::convolve
          (Distributions *this,vector<double,_std::allocator<double>_> *dist1,
          vector<double,_std::allocator<double>_> *dist2,int offset1,int offset2,int *offset_result)

{
  vector<double,std::allocator<double>> *this_00;
  iterator __position;
  bool bVar1;
  undefined8 *puVar2;
  pointer pdVar3;
  ulong uVar4;
  pointer pdVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  pointer *__ptr;
  int iVar9;
  long lVar10;
  long lVar11;
  size_type __new_size;
  int iVar12;
  long lVar13;
  ulong uVar14;
  double p;
  double local_40;
  int *local_38;
  
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  *(undefined8 **)this = puVar2;
  *offset_result = offset1 + offset2;
  pdVar3 = (dist1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(dist1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
  pdVar5 = (dist2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)(dist2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
  local_38 = offset_result;
  if ((int)lVar11 + (int)lVar8 < 2) {
    __new_size = 0;
  }
  else {
    lVar13 = -8;
    uVar14 = 0xffffffff;
    lVar10 = 0;
    do {
      local_40 = 0.0;
      iVar9 = (int)lVar10;
      iVar12 = iVar9 - (int)lVar11;
      if (iVar12 < 0) {
        iVar12 = -1;
      }
      iVar7 = (int)lVar8 + -1;
      if (iVar9 <= iVar7) {
        iVar7 = iVar9;
      }
      if (iVar12 < iVar7) {
        local_40 = 0.0;
        lVar8 = -(int)lVar11 + lVar10;
        if (lVar8 < 0) {
          lVar8 = -1;
        }
        pdVar6 = (double *)((long)pdVar5 + lVar13 + lVar8 * -8);
        do {
          lVar11 = lVar8 + 1;
          lVar8 = lVar8 + 1;
          local_40 = local_40 + pdVar3[lVar11] * *pdVar6;
          pdVar6 = pdVar6 + -1;
        } while (lVar8 < iVar7);
      }
      this_00 = *(vector<double,std::allocator<double>> **)this;
      __position._M_current = *(double **)(this_00 + 8);
      if ((((long)__position._M_current - *(long *)this_00 != 0) || (local_40 != 0.0)) ||
         (NAN(local_40))) {
        uVar4 = (ulong)((long)__position._M_current - *(long *)this_00) >> 3;
        if (local_40 != 0.0) {
          uVar14 = uVar4 & 0xffffffff;
        }
        if (NAN(local_40)) {
          uVar14 = uVar4 & 0xffffffff;
        }
        if (__position._M_current == *(double **)(this_00 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (this_00,__position,&local_40);
        }
        else {
          *__position._M_current = local_40;
          *(double **)(this_00 + 8) = __position._M_current + 1;
        }
      }
      else {
        *local_38 = *local_38 + 1;
      }
      pdVar3 = (dist1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = (long)(dist1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
      pdVar5 = (dist2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = (long)(dist2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
      lVar13 = lVar13 + 8;
      bVar1 = lVar10 < (int)lVar11 + (int)lVar8 + -2;
      lVar10 = lVar10 + 1;
    } while (bVar1);
    __new_size = (size_type)((int)uVar14 + 1);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (*(vector<double,_std::allocator<double>_> **)this,__new_size);
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<double> > Distributions::convolve(const vector<double>& dist1, const vector<double>& dist2, int offset1, int offset2, int* offset_result) {
	unique_ptr<vector<double> > result(new vector<double>());
	*offset_result = offset1 + offset2;
	int rightmost_nonzero = -1;
	for (int n = 0; n <= ((int)(dist1.size()+dist2.size()))-2; ++n) {
		double p = 0.0;
		for (int i = max(0, n-((int)dist2.size())+1); i <= min(n, ((int)dist1.size())-1); ++i) {
			p += dist1[i]*dist2[n-i];
		}
		if ((result->size() == 0) && (p == 0.0)) {
			*offset_result += 1;
			continue;
		}
		if (p != 0.0) {
			rightmost_nonzero = result->size();
		}
		result->push_back(p);
	}
	result->resize(rightmost_nonzero+1);
	return result;
}